

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_from_text_l
                  (archive_acl *acl,char *text,wchar_t want_type,archive_string_conv *sc)

{
  int iVar1;
  wchar_t wVar2;
  bool bVar3;
  char *local_108;
  char *end;
  char *start;
  ulong uStack_f0;
  char sep;
  size_t len;
  wchar_t local_e0;
  wchar_t id;
  wchar_t permset;
  wchar_t tag;
  wchar_t types;
  wchar_t type;
  wchar_t ret;
  wchar_t sol;
  wchar_t r;
  wchar_t n;
  wchar_t fields;
  wchar_t numfields;
  char *st;
  char *s;
  anon_struct_16_2_267fbce2 name;
  anon_struct_16_2_267fbce2 field [6];
  archive_string_conv *sc_local;
  char *pcStack_20;
  wchar_t want_type_local;
  char *text_local;
  archive_acl *acl_local;
  
  sc_local._4_4_ = want_type;
  if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
    if (want_type != L'̀') {
      if (want_type != L'㰀') {
        return L'\xffffffe2';
      }
      n = L'\x06';
      goto LAB_007667e4;
    }
    sc_local._4_4_ = L'Ā';
  }
  n = L'\x05';
LAB_007667e4:
  types = L'\0';
  permset = L'\0';
  pcStack_20 = text;
  text_local = (char *)acl;
LAB_007667f8:
  while( true ) {
    do {
      bVar3 = false;
      if (pcStack_20 != (char *)0x0) {
        bVar3 = *pcStack_20 != '\0';
      }
      if (!bVar3) {
        archive_acl_reset((archive_acl *)text_local,permset);
        return types;
      }
      r = L'\0';
      do {
        next_field(&stack0xffffffffffffffe0,&end,&local_108,(char *)((long)&start + 7));
        if (r < n) {
          field[(long)r + -1].end = end;
          field[r].start = local_108;
        }
        r = r + L'\x01';
        wVar2 = r;
      } while (start._7_1_ == ':');
      while (sol = wVar2, sol < n) {
        field[sol].start = (char *)0x0;
        field[(long)sol + -1].end = (char *)0x0;
        wVar2 = sol + L'\x01';
      }
    } while ((name.end != (char *)0x0) && (*name.end == '#'));
    sol = L'\0';
    type = L'\0';
    len._4_4_ = L'\xffffffff';
    local_e0 = L'\0';
    name.start = (char *)0x0;
    s = (char *)0x0;
    if (sc_local._4_4_ != L'㰀') break;
    st = name.end;
    uStack_f0 = (long)field[0].start - (long)name.end;
    id = L'\0';
    if (uStack_f0 - 4 < 5 || uStack_f0 == 9) {
      switch((long)&switchD_00766f3c::switchdataD_0097429c +
             (long)(int)(&switchD_00766f3c::switchdataD_0097429c)[uStack_f0 - 4]) {
      case 0x766f3e:
        if (*(int *)name.end == 0x72657375) {
          id = L'✑';
        }
        break;
      case 0x766f66:
        iVar1 = memcmp(name.end,"group",5);
        if (iVar1 == 0) {
          id = L'✓';
        }
        break;
      case 0x766f8f:
        iVar1 = memcmp(name.end,"owner@",6);
        if (iVar1 == 0) {
          id = L'✒';
        }
        else {
          iVar1 = memcmp(st,"group@",6);
          if (iVar1 == 0) {
            id = L'✔';
          }
        }
        break;
      case 0x766fe3:
        iVar1 = memcmp(name.end,"everyone@",9);
        if (iVar1 == 0) {
          id = L'❻';
        }
        break;
      case 0x76700c:
        goto switchD_00766f3c_caseD_76700c;
      }
    }
    else {
switchD_00766f3c_caseD_76700c:
    }
    if (id == L'\0') {
      types = L'\xffffffec';
    }
    else {
      if ((id == L'✑') || (id == L'✓')) {
        sol = L'\x01';
        s = field[0].end;
        name.start = field[1].start;
        isint(field[0].end,field[1].start,(wchar_t *)((long)&len + 4));
      }
      else {
        sol = L'\0';
      }
      wVar2 = is_nfs4_perms(field[(long)(sol + L'\x01') + -1].end,field[sol + L'\x01'].start,
                            &local_e0);
      if (wVar2 == L'\0') {
        types = L'\xffffffec';
      }
      else {
        wVar2 = is_nfs4_flags(field[(long)(sol + L'\x02') + -1].end,field[sol + L'\x02'].start,
                              &local_e0);
        if (wVar2 == L'\0') {
          types = L'\xffffffec';
        }
        else {
          st = field[(long)(sol + L'\x03') + -1].end;
          uStack_f0 = (long)field[sol + L'\x03'].start - (long)field[(long)(sol + L'\x03') + -1].end
          ;
          tag = L'\0';
          if (uStack_f0 == 4) {
            if (*(int *)st == 0x796e6564) {
              tag = L'ࠀ';
            }
          }
          else if (uStack_f0 == 5) {
            iVar1 = memcmp(st,"allow",5);
            if (iVar1 == 0) {
              tag = L'Ѐ';
            }
            else {
              iVar1 = memcmp(st,"audit",5);
              if (iVar1 == 0) {
                tag = L'က';
              }
              else {
                iVar1 = memcmp(st,"alarm",5);
                if (iVar1 == 0) {
                  tag = L'\x2000';
                }
              }
            }
          }
          if (tag == L'\0') {
            types = L'\xffffffec';
          }
          else {
            isint(field[(long)(sol + L'\x04') + -1].end,field[sol + L'\x04'].start,
                  (wchar_t *)((long)&len + 4));
LAB_007672cb:
            ret = archive_acl_add_entry_len_l
                            ((archive_acl *)text_local,tag,local_e0,id,len._4_4_,s,
                             (long)name.start - (long)s,sc);
            if (ret < L'\xffffffec') {
              return ret;
            }
            if (ret != L'\0') {
              types = L'\xffffffec';
            }
            permset = tag | permset;
          }
        }
      }
    }
  }
  st = name.end;
  uStack_f0 = (long)field[0].start - (long)name.end;
  if ((*name.end == 'd') &&
     ((uStack_f0 == 1 || ((6 < uStack_f0 && (iVar1 = memcmp(name.end + 1,"efault",6), iVar1 == 0))))
     )) {
    tag = L'Ȁ';
    if (uStack_f0 < 8) {
      sol = L'\x01';
    }
    else {
      name.end = name.end + 7;
    }
  }
  else {
    tag = sc_local._4_4_;
  }
  isint(field[(long)(sol + L'\x01') + -1].end,field[sol + L'\x01'].start,(wchar_t *)((long)&len + 4)
       );
  if ((len._4_4_ == L'\xffffffff') && (sol + L'\x03' < r)) {
    isint(field[(long)(sol + L'\x03') + -1].end,field[sol + L'\x03'].start,
          (wchar_t *)((long)&len + 4));
  }
  id = L'\0';
  st = field[(long)sol + -1].end;
  _fields = (int *)(field[(long)sol + -1].end + 1);
  uStack_f0 = (long)field[sol].start - (long)field[(long)sol + -1].end;
  switch(*st) {
  case 'g':
    if ((uStack_f0 == 1) || ((uStack_f0 == 5 && (*_fields == 0x70756f72)))) {
      id = L'✔';
    }
    break;
  default:
    break;
  case 'm':
    if ((uStack_f0 == 1) || ((uStack_f0 == 4 && (iVar1 = memcmp(_fields,"ask",3), iVar1 == 0)))) {
      id = L'✕';
    }
    break;
  case 'o':
    if ((uStack_f0 == 1) || ((uStack_f0 == 5 && (*_fields == 0x72656874)))) {
      id = L'✖';
    }
    break;
  case 'u':
    if ((uStack_f0 == 1) || ((uStack_f0 == 4 && (iVar1 = memcmp(_fields,"ser",3), iVar1 == 0)))) {
      id = L'✒';
    }
  }
  if ((id == L'✒') || (id == L'✔')) {
    if ((len._4_4_ != L'\xffffffff') ||
       (field[(long)(sol + L'\x01') + -1].end < field[sol + L'\x01'].start)) {
      s = field[(long)(sol + L'\x01') + -1].end;
      name.start = field[sol + L'\x01'].start;
      if (id == L'✒') {
        id = L'✑';
      }
      else {
        id = L'✓';
      }
    }
  }
  else {
    if (id != L'✕' && id != L'✖') {
      types = L'\xffffffec';
      goto LAB_007667f8;
    }
    if (((r == sol + L'\x02') &&
        (field[(long)(sol + L'\x01') + -1].end < field[sol + L'\x01'].start)) &&
       (wVar2 = ismode(field[(long)(sol + L'\x01') + -1].end,field[sol + L'\x01'].start,&local_e0),
       wVar2 != L'\0')) {
      type = L'\x01';
      goto LAB_00766e66;
    }
    if ((r == sol + L'\x03') && (field[(long)(sol + L'\x01') + -1].end < field[sol + L'\x01'].start)
       ) {
      types = L'\xffffffec';
      goto LAB_007667f8;
    }
  }
LAB_00766e66:
  if ((local_e0 != L'\0') ||
     (wVar2 = ismode(field[(long)((sol + L'\x02') - type) + -1].end,
                     field[(sol + L'\x02') - type].start,&local_e0), wVar2 != L'\0'))
  goto LAB_007672cb;
  types = L'\xffffffec';
  goto LAB_007667f8;
}

Assistant:

int
archive_acl_from_text_l(struct archive_acl *acl, const char *text,
    int want_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[6], name;

	const char *s, *st;
	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	char sep;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		__LA_FALLTHROUGH;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	ret = ARCHIVE_OK;
	types = 0;

	while (text != NULL  &&  *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == '#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == 'd' && (len == 1 || (len >= 7
			    && memcmp((s + 1), "efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > (n + 3))
				isint(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			switch (*s) {
			case 'u':
				if (len == 1 || (len == 4
				    && memcmp(st, "ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case 'g':
				if (len == 1 || (len == 5
				    && memcmp(st, "roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 'o':
				if (len == 1 || (len == 5
				    && memcmp(st, "ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case 'm':
				if (len == 1 || (len == 4
				    && memcmp(st, "ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 3
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (memcmp(s, "user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (memcmp(s, "group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (memcmp(s, "owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (memcmp(s, "group@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (memcmp(s, "everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
				break;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (memcmp(s, "deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (memcmp(s, "allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (memcmp(s, "audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (memcmp(s, "alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint(field[4 + n].start, field[4 + n].end,
			    &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}